

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdCreateAddress(void *handle,int hash_type,char *pubkey,char *redeem_script,int network_type,
                    char **address,char **locking_script,char **p2sh_segwit_locking_script)

{
  pointer pcVar1;
  pointer puVar2;
  bool bVar3;
  NetType type;
  AddressType address_type;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  CfdException *this;
  char *work_locking_script;
  char *work_address;
  Script lock_script;
  Script script;
  Script unlocking_script;
  Address addr;
  bool local_4b9;
  undefined1 local_4b8 [8];
  pointer puStack_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  void *local_490;
  Pubkey local_488;
  char *local_468;
  char *local_460;
  Pubkey local_458;
  char **local_438;
  undefined8 local_430;
  SchnorrPubkey local_428;
  ByteData local_410;
  ByteData local_3f8;
  ByteData local_3e0;
  Script local_3c8;
  undefined1 local_390 [32];
  undefined1 local_370 [16];
  pointer local_360;
  pointer local_348;
  pointer local_330;
  TapBranch local_318;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2a0;
  Script local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  Script local_218;
  Script local_1e0;
  undefined1 local_1a8 [32];
  char local_188 [16];
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_460 = (char *)0x0;
  local_468 = (char *)0x0;
  local_430 = 0;
  local_490 = handle;
  cfd::Initialize();
  local_438 = address;
  if (address == (char **)0x0) {
    local_1a8._0_8_ = "cfdcapi_address.cpp";
    local_1a8._8_4_ = 0x8f;
    local_1a8._16_8_ = "CfdCreateAddress";
    cfd::core::logger::log<>((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"address is null.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. address is null.","");
    cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_4b9 = false;
  type = cfd::capi::ConvertNetType(network_type,&local_4b9);
  cfd::core::Address::Address((Address *)local_1a8);
  address_type = cfd::capi::ConvertHashToAddressType(0);
  cfd::core::Pubkey::Pubkey(&local_488);
  cfd::core::Script::Script(&local_218);
  cfd::core::Script::Script(&local_3c8);
  cfd::core::Script::Script(&local_1e0);
  if ((pubkey == (char *)0x0) || (*pubkey == '\0')) goto LAB_003d4a6a;
  pcVar1 = local_390 + 0x10;
  local_390._0_8_ = pcVar1;
  if (address_type == kTaprootAddress) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"02","");
    cfd::core::ByteData::ByteData(&local_3f8,(string *)local_390);
    local_4b8 = (undefined1  [8])&local_4a8;
    sVar4 = strlen(pubkey);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,pubkey,pubkey + sVar4);
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_428,(string *)local_4b8);
    cfd::core::SchnorrPubkey::GetData(&local_410,&local_428);
    cfd::core::ByteData::Concat<cfd::core::ByteData>(&local_3e0,&local_3f8,&local_410);
    cfd::core::Pubkey::Pubkey(&local_458,&local_3e0);
    puVar2 = local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)puVar2 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       (operator_delete(puVar2),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_458.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete(local_458.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_3e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3e0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_410.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_410.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_428.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_428.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_4b8 != (undefined1  [8])&local_4a8) {
      operator_delete((void *)local_4b8);
    }
LAB_003d4a4e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_3f8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    sVar4 = strlen(pubkey);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,pubkey,pubkey + sVar4);
    cfd::core::Pubkey::Pubkey((Pubkey *)local_4b8,(string *)local_390);
    puVar2 = local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_4b8;
    local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_4b0;
    local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_4a8._M_allocated_capacity;
    local_4b8 = (undefined1  [8])0x0;
    puStack_4b0 = (pointer)0x0;
    local_4a8._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar2);
      local_3f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_4b8;
      goto LAB_003d4a4e;
    }
  }
  if ((pointer)local_390._0_8_ != pcVar1) {
    operator_delete((void *)local_390._0_8_);
  }
LAB_003d4a6a:
  if ((redeem_script != (char *)0x0) && (*redeem_script != '\0')) {
    local_4b8 = (undefined1  [8])&local_4a8;
    sVar4 = strlen(redeem_script);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b8,redeem_script,redeem_script + sVar4);
    cfd::core::Script::Script((Script *)local_390,(string *)local_4b8);
    cfd::core::Script::operator=(&local_218,(Script *)local_390);
    cfd::core::Script::~Script((Script *)local_390);
    if (local_4b8 != (undefined1  [8])&local_4a8) {
      operator_delete((void *)local_4b8);
    }
  }
  if (local_4b9 == true) {
    cfd::AddressFactory::AddressFactory((AddressFactory *)local_4b8,type);
    cfd::AddressFactory::CreateAddress
              ((Address *)local_390,(AddressFactory *)local_4b8,address_type,&local_488,&local_218,
               &local_3c8,&local_1e0);
    cfd::core::Address::operator=((Address *)local_1a8,(Address *)local_390);
  }
  else {
    cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_4b8,type);
    cfd::AddressFactory::CreateAddress
              ((Address *)local_390,(AddressFactory *)local_4b8,address_type,&local_488,&local_218,
               &local_3c8,&local_1e0);
    cfd::core::Address::operator=((Address *)local_1a8,(Address *)local_390);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_248);
  cfd::core::Script::~Script(&local_288);
  local_318._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2a0);
  cfd::core::TapBranch::~TapBranch(&local_318);
  if (local_330 != (pointer)0x0) {
    operator_delete(local_330);
  }
  if (local_348 != (pointer)0x0) {
    operator_delete(local_348);
  }
  if (local_360 != (pointer)0x0) {
    operator_delete(local_360);
  }
  if ((undefined1 *)local_390._16_8_ != local_370) {
    operator_delete((void *)local_390._16_8_);
  }
  local_4b8 = (undefined1  [8])&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_4a8);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_390,(Address *)local_1a8);
  pcVar5 = cfd::capi::CreateString((string *)local_390);
  pcVar1 = local_390 + 0x10;
  local_460 = pcVar5;
  if ((pointer)local_390._0_8_ != pcVar1) {
    operator_delete((void *)local_390._0_8_);
  }
  if ((locking_script == (char **)0x0) || (bVar3 = cfd::core::Script::IsEmpty(&local_3c8), bVar3)) {
    pcVar6 = (char *)0x0;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_390,&local_3c8);
    pcVar6 = cfd::capi::CreateString((string *)local_390);
    local_468 = pcVar6;
    if ((pointer)local_390._0_8_ != pcVar1) {
      operator_delete((void *)local_390._0_8_);
    }
  }
  if ((p2sh_segwit_locking_script == (char **)0x0) ||
     (bVar3 = cfd::core::Script::IsEmpty(&local_1e0), bVar3)) {
    pcVar7 = (char *)0x0;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_390,&local_1e0);
    pcVar7 = cfd::capi::CreateString((string *)local_390);
    if ((pointer)local_390._0_8_ != pcVar1) {
      operator_delete((void *)local_390._0_8_);
    }
  }
  *local_438 = pcVar5;
  if (pcVar6 != (char *)0x0) {
    *locking_script = pcVar6;
  }
  if (pcVar7 != (char *)0x0) {
    *p2sh_segwit_locking_script = pcVar7;
  }
  cfd::core::Script::~Script(&local_1e0);
  cfd::core::Script::~Script(&local_3c8);
  cfd::core::Script::~Script(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_488.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  cfd::core::Script::~Script(&local_a0);
  local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  cfd::core::TapBranch::~TapBranch(&local_130);
  if (local_148 != (pointer)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (pointer)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (pointer)0x0) {
    operator_delete(local_178);
  }
  if ((char *)local_1a8._16_8_ != local_188) {
    operator_delete((void *)local_1a8._16_8_);
  }
  return 0;
}

Assistant:

int CfdCreateAddress(
    void* handle, int hash_type, const char* pubkey, const char* redeem_script,
    int network_type, char** address, char** locking_script,
    char** p2sh_segwit_locking_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_locking_script = nullptr;
  char* work_p2sh_segwit_locking_script = nullptr;
  try {
    cfd::Initialize();
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Pubkey pubkey_obj;
    Script script;
    Script lock_script;
    Script unlocking_script;

    if ((pubkey != nullptr) && (*pubkey != '\0')) {
      if (addr_type == AddressType::kTaprootAddress) {
        pubkey_obj =
            Pubkey(ByteData("02").Concat(SchnorrPubkey(pubkey).GetData()));
      } else {
        pubkey_obj = Pubkey(pubkey);
      }
    }
    if ((redeem_script != nullptr) && (*redeem_script != '\0')) {
      script = Script(redeem_script);
    }

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    work_address = CreateString(addr.GetAddress());
    if (locking_script != nullptr) {
      if (!lock_script.IsEmpty()) {
        work_locking_script = CreateString(lock_script.GetHex());
      }
    }
    if (p2sh_segwit_locking_script != nullptr) {
      if (!unlocking_script.IsEmpty()) {
        work_p2sh_segwit_locking_script =
            CreateString(unlocking_script.GetHex());
      }
    }

    *address = work_address;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_p2sh_segwit_locking_script != nullptr)
      *p2sh_segwit_locking_script = work_p2sh_segwit_locking_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_address, &work_locking_script, &work_p2sh_segwit_locking_script);
  return result;
}